

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLException.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLException::loadExceptText(XMLException *this,Codes toLoad)

{
  short *psVar1;
  MemoryManager *pMVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 in_register_00000034;
  short *psVar5;
  size_t __n;
  XMLCh errText [2048];
  short local_1018 [2048];
  XMLCh *__dest;
  
  psVar5 = local_1018;
  this->fCode = toLoad;
  cVar3 = (**(code **)(*sMsgLoader + 0x10))
                    (sMsgLoader,CONCAT44(in_register_00000034,toLoad),local_1018,0x7ff);
  pMVar2 = this->fMemoryManager;
  __n = 0;
  if (cVar3 == '\0') {
    do {
      psVar5 = (short *)((long)&XMLUni::fgDefErrMsg + __n);
      __n = __n + 2;
    } while (*psVar5 != 0);
    iVar4 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,__n);
    __dest = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
    psVar5 = &XMLUni::fgDefErrMsg;
  }
  else {
    do {
      psVar1 = (short *)((long)local_1018 + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar4 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,__n);
    __dest = (XMLCh *)CONCAT44(extraout_var,iVar4);
  }
  memcpy(__dest,psVar5,__n);
  this->fMsg = __dest;
  return;
}

Assistant:

void XMLException::loadExceptText(const XMLExcepts::Codes toLoad)
{
    // Store the error code
    fCode = toLoad;

    // Load up the text into a local buffer
    const XMLSize_t msgSize = 2047;
    XMLCh errText[msgSize + 1];

    // load the text
	if (!gGetMsgLoader().loadMsg(toLoad, errText, msgSize))
	{
		fMsg = XMLString::replicate
        (
        XMLUni::fgDefErrMsg
            , fMemoryManager
        );
		return;
	}

    // We got the text so replicate it into the message member
    fMsg = XMLString::replicate(errText, fMemoryManager);
}